

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O2

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::splitExtBorders
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,IntervalT *I)

{
  _Rb_tree_header *hint;
  type in_RAX;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  hint_00;
  iterator I_00;
  _Base_ptr p_Var1;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  _Var2;
  Offset OVar3;
  bool bVar4;
  Offset local_38;
  
  local_38.offset = in_RAX;
  hint_00._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,_std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>,_std::_Select1st<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
       ::lower_bound((_Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,_std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>,_std::_Select1st<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                      *)this,I);
  hint = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)hint_00._M_node == hint) {
    _Var2._M_node = (_Base_ptr)std::_Rb_tree_decrement(&hint->_M_header);
    p_Var1 = _Var2._M_node[1]._M_parent;
    OVar3.offset = (I->end).offset;
    bVar4 = OVar3.offset < p_Var1;
    if (OVar3.offset < p_Var1) {
      _Var2 = DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
              splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                        ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)this,_Var2,OVar3,
                         hint_00);
      p_Var1 = _Var2._M_node[1]._M_parent;
    }
    if (p_Var1 < (_Base_ptr)(I->start).offset) {
      return bVar4;
    }
    local_38.offset = 1;
    OVar3 = Offset::operator-(&I->start,&local_38);
  }
  else {
    OVar3.offset = (I->end).offset;
    I_00 = (iterator)hint_00._M_node;
    do {
      if (OVar3.offset < *(ulong *)(I_00._M_node + 1)) break;
      if (OVar3.offset < I_00._M_node[1]._M_parent) {
        DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
        splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                  ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)this,
                   (_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    )I_00._M_node,OVar3,
                   (_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    )hint);
        hint_00._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,_std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>,_std::_Select1st<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
             ::lower_bound((_Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,_std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>,_std::_Select1st<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                            *)this,I);
        bVar4 = true;
        goto LAB_00122d65;
      }
      I_00._M_node = (_Base_ptr)std::_Rb_tree_increment(I_00._M_node);
    } while ((_Rb_tree_header *)I_00._M_node != hint);
    bVar4 = false;
LAB_00122d65:
    if (hint_00._M_node == (this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      return bVar4;
    }
    _Var2._M_node = (_Base_ptr)std::_Rb_tree_decrement(hint_00._M_node);
    p_Var1 = _Var2._M_node[1]._M_parent;
    if ((_Base_ptr)(I->start).offset <= p_Var1) {
      local_38.offset = 1;
      OVar3 = Offset::operator-(&I->start,&local_38);
      hint_00 = DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
                splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                          ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)this,_Var2,OVar3,
                           hint_00);
      bVar4 = true;
    }
    OVar3.offset = (I->end).offset;
    if (p_Var1 <= OVar3.offset) {
      return bVar4;
    }
    _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(hint_00._M_node);
    hint_00._M_node = &hint->_M_header;
  }
  DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
  splitIntervalHint<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
            ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)this,_Var2,OVar3,hint_00);
  return true;
}

Assistant:

bool splitExtBorders(const IntervalT &I) {
        assert(!_mapping.empty());
        bool changed = false;

        auto ge = _mapping.lower_bound(I);
        if (ge == _mapping.end()) {
            // the last interval must start somewhere to the
            // left from our new interval
            auto last = _get_last();
            assert(last->first.start < I.start);

            if (last->first.end > I.end) {
                last = splitIntervalHint(last, I.end, ge);
                changed |= true;
            }

            if (last->first.end >= I.start) {
                splitIntervalHint(last, I.start - 1, ge);
                changed |= true;
            }
            return changed;
        }

        // we found an interval starting at I.start
        // or later
        assert(ge->first.start >= I.start);
        // FIXME: optimize this...
        //  add _find_le to find the "closest" interval from the right
        //  (maybe iterating like this is faster, though)
        auto it = ge;
        while (it->first.start <= I.end) {
            if (it->first.end > I.end) {
                it = splitIntervalHint(it, I.end, _mapping.end());
                changed = true;
                break;
            }
            ++it;
            if (it == _mapping.end())
                break;
        }

        // we may have also overlap from the previous interval
        if (changed)
            ge = _mapping.lower_bound(I);
        if (ge != _mapping.begin()) {
            auto prev = ge;
            --prev;
            auto prev_end = prev->first.end;
            if (prev_end >= I.start) {
                ge = splitIntervalHint(prev, I.start - 1, ge);
                changed = true;
            }
            // is the new interval entirely covered by the previous?
            if (prev_end > I.end) {
                // get the higher of the new intervals
                ++ge;
                assert(ge != _mapping.end());
                assert(ge->first.end == prev_end);
#ifndef NDEBUG
                auto check =
#endif
                        splitIntervalHint(ge, I.end, _mapping.end());
                assert(check->first == I);
                changed = true;
            }
        }

        return changed;
    }